

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erase
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  size_t sVar1;
  _func_int *p_Var2;
  bool bVar3;
  unsigned_long_long *puVar4;
  unsigned_long_long *__src;
  int iVar5;
  int iVar6;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  _func_int **pp_Var8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  node *pnVar9;
  long lVar10;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  undefined1 *puVar11;
  locType *plVar12;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar13;
  node **ppnVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 *__dest;
  undefined8 uStack_a0;
  undefined1 auStack_98 [4];
  int local_94;
  locType *local_90;
  long local_88;
  undefined1 *local_80;
  unsigned_long_long local_78;
  size_t local_70;
  unsigned_long_long *local_68;
  int *local_60;
  undefined1 *local_58;
  unsigned_long_long *local_50;
  node **local_48;
  node **local_40;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *local_38;
  node *pnVar7;
  
  iVar5 = this->depth;
  lVar16 = (long)iVar5;
  if (lVar16 == 0) {
    return false;
  }
  uVar17 = lVar16 * 8 + 8;
  if (iVar5 < -1) {
    uVar17 = 0xffffffffffffffff;
  }
  uVar20 = lVar16 * 4 + 4;
  if (iVar5 < -1) {
    uVar20 = 0xffffffffffffffff;
  }
  uStack_a0 = 0x10cc85;
  local_48 = (node **)key;
  local_38 = this;
  pos = (locType *)operator_new__(uVar17);
  *pos = 0;
  uStack_a0 = 0x10cc97;
  p = (node **)operator_new__(uVar17);
  uStack_a0 = 0x10cca2;
  pp = (int *)operator_new__(uVar20);
  *pos = local_38->root;
  if (iVar5 < 1) {
    ppnVar14 = p + lVar16;
    pnVar7 = p[lVar16 + -1];
    iVar6 = pnVar7->sz;
  }
  else {
    lVar16 = 0;
    local_60 = pp;
    local_40 = p;
    do {
      uStack_a0 = 0x10ccd7;
      iVar5 = (*(local_38->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(local_38->file,pos + lVar16);
      pnVar7 = (node *)CONCAT44(extraout_var,iVar5);
      local_40[lVar16] = pnVar7;
      uVar15 = pnVar7->sz;
      uVar20 = 0;
      if (0 < (long)(int)uVar15) {
        uVar20 = 0;
        do {
          if (*local_48 <= (node *)pnVar7->keyvalue[uVar20]) {
            iVar5 = local_38->depth;
            if ((long)iVar5 + -1 <= lVar16) goto LAB_0010cd49;
            uVar20 = (ulong)(((int)uVar20 + 1) -
                            (uint)(*local_48 < (node *)pnVar7->keyvalue[uVar20]));
            goto LAB_0010cd3e;
          }
          uVar20 = uVar20 + 1;
        } while ((long)(int)uVar15 != uVar20);
        uVar20 = (ulong)uVar15;
      }
      iVar5 = local_38->depth;
      if (lVar16 < (long)iVar5 + -1) {
LAB_0010cd3e:
        (pos + lVar16)[1] = (pnVar7->field_0).val[(int)uVar20];
      }
LAB_0010cd49:
      local_60[lVar16] = (int)uVar20;
      lVar16 = lVar16 + 1;
      lVar10 = (long)iVar5;
    } while (lVar16 < lVar10);
    pnVar7 = local_40[lVar10 + -1];
    iVar6 = pnVar7->sz;
    p = local_40;
    pp = local_60;
    if ((int)uVar20 == iVar6) goto LAB_0010cdac;
    ppnVar14 = local_40 + lVar10;
  }
  ppnVar14 = ppnVar14 + -1;
  iVar18 = (int)uVar20;
  if (*local_48 < (node *)pnVar7->keyvalue[iVar18]) {
LAB_0010cdac:
    uStack_a0 = 0x10cdb4;
    operator_delete__(p);
    uStack_a0 = 0x10cdbc;
    operator_delete__(pp);
    uStack_a0 = 0x10cdc4;
    operator_delete__(pos);
    return false;
  }
  if (1 < iVar5 && iVar18 == 0) {
    plVar12 = pos + (iVar5 - 2);
    lVar16 = (ulong)(iVar5 - 2) + 1;
    do {
      lVar10 = (long)pp[lVar16 + -1];
      if ((lVar10 != 0) && (p[lVar16 + -1]->keyvalue[lVar10 + -1] == pnVar7->keyvalue[0])) {
        p[lVar16 + -1]->keyvalue[lVar10 + -1] = pnVar7->keyvalue[1];
        uStack_a0 = 0x10ce30;
        (*(local_38->file->
          super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          )._vptr_FileManager_Base[3])(local_38->file,plVar12);
        pnVar7 = *ppnVar14;
        iVar6 = pnVar7->sz;
        break;
      }
      plVar12 = plVar12 + -1;
      lVar10 = lVar16 + -1;
      bVar3 = 0 < lVar16;
      lVar16 = lVar10;
    } while (lVar10 != 0 && bVar3);
  }
  this_00 = local_38;
  if (iVar18 + 1 < iVar6) {
    lVar16 = (long)(iVar18 + 1);
    do {
      iVar5 = (int)uVar20;
      pnVar7->keyvalue[iVar5] = pnVar7->keyvalue[lVar16];
      (pnVar7->field_0).val[iVar5] = (pnVar7->field_0).val[lVar16];
      lVar16 = lVar16 + 1;
      pnVar7 = *ppnVar14;
      iVar6 = pnVar7->sz;
      uVar20 = (ulong)(iVar5 + 1);
    } while (lVar16 < iVar6);
  }
  pnVar7->sz = iVar6 + -1;
  lVar16 = (long)local_38->depth;
  if (lVar16 == 1) {
    if (iVar6 + -1 == 0) {
      local_38->depth = 0;
      uStack_a0 = 0x10cf4d;
      DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      ::release(local_38->file,local_38->root);
      this_00->root = -1;
      puVar11 = auStack_98;
      goto LAB_0010d2a7;
    }
    plVar12 = &local_38->root;
    pDVar13 = local_38->file;
    pp_Var8 = (pDVar13->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base;
  }
  else {
    if (iVar6 < 0x33) {
      iVar5 = pp[lVar16 + -2];
      pnVar7 = p[lVar16 + -2];
      local_48 = ppnVar14;
      if (iVar5 == pnVar7->sz) {
        p[lVar16] = p[lVar16 + -1];
        pp[lVar16] = iVar5;
        pos[lVar16] = pos[lVar16 + -1];
        iVar5 = pnVar7->sz;
        pp[lVar16 + -2] = iVar5 + -1;
        pos[lVar16 + -1] = *(locType *)((long)pnVar7 + (long)iVar5 * 8 + -8);
        uStack_a0 = 0x10cf21;
        iVar6 = (*(local_38->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])(local_38->file,pos + lVar16 + -1);
        iVar5 = local_38->depth;
        lVar16 = (long)iVar5;
        p[lVar16 + -1] = (node *)CONCAT44(extraout_var_00,iVar6);
        pnVar7 = p[lVar16];
      }
      else {
        pp[lVar16] = iVar5 + 1;
        pos[lVar16] = *(locType *)((long)&pnVar7->field_0 + (long)iVar5 * 8 + 8);
        uStack_a0 = 0x10cf7d;
        iVar5 = (*(local_38->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])(local_38->file,pos + lVar16);
        pnVar7 = (node *)CONCAT44(extraout_var_01,iVar5);
        iVar5 = local_38->depth;
        lVar16 = (long)iVar5;
        p[lVar16] = pnVar7;
      }
      this_00 = local_38;
      pnVar9 = *local_48;
      uVar17 = (ulong)(uint)pnVar9->sz;
      uVar15 = pnVar7->sz + pnVar9->sz;
      if ((int)uVar15 < 100) {
        if (0 < pnVar7->sz) {
          lVar10 = 0;
          do {
            (pnVar9->field_0).val[(int)uVar17 + lVar10] = (pnVar7->field_0).val[lVar10];
            pnVar7 = p[lVar16];
            pnVar9 = *local_48;
            iVar6 = pnVar9->sz;
            uVar17 = (ulong)iVar6;
            pnVar9->keyvalue[uVar17 + lVar10] = pnVar7->keyvalue[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 < pnVar7->sz);
          iVar5 = local_38->depth;
          uVar15 = pnVar7->sz + iVar6;
        }
        pnVar9->nxt = pnVar7->nxt;
        pnVar9->sz = uVar15;
        uStack_a0 = 0x10d245;
        (*(local_38->file->
          super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          )._vptr_FileManager_Base[3])(local_38->file,pos + (long)iVar5 + -1);
        uStack_a0 = 0x10d255;
        DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        ::release(this_00->file,pos[this_00->depth]);
        local_94 = this_00->depth + -2;
        uStack_a0 = 0x10d274;
        erasenonleaf(this_00,&local_94,p,pp,pos);
        puVar11 = auStack_98;
      }
      else {
        local_60 = pp;
        local_90 = pos;
        local_80 = auStack_98;
        puVar11 = auStack_98 + -((ulong)uVar15 * 8 + 0x17 & 0xfffffffffffffff0);
        __dest = puVar11 + -((ulong)uVar15 * 8 + 0xf & 0xfffffffffffffff0);
        local_40 = p;
        local_88 = lVar16;
        pnVar9 = p[lVar16];
        local_78 = pnVar9->keyvalue[0];
        pnVar7 = *local_48;
        uVar19 = pnVar7->sz;
        lVar16 = (long)(int)uVar19;
        local_58 = puVar11;
        if (0 < lVar16) {
          local_50 = pnVar7->keyvalue;
          local_68 = (unsigned_long_long *)(lVar16 * 8);
          *(undefined8 *)(__dest + -8) = 0x10d08a;
          memcpy(puVar11,pnVar7,(size_t)(lVar16 * 8));
          __src = local_50;
          puVar4 = local_68;
          *(undefined8 *)(__dest + -8) = 0x10d09a;
          memcpy(__dest,__src,(size_t)puVar4);
        }
        local_50 = (unsigned_long_long *)__dest;
        if ((int)uVar19 < (int)uVar15) {
          local_68 = pnVar9->keyvalue;
          puVar11 = local_58 + lVar16 * 8;
          sVar1 = (ulong)(~uVar19 + uVar15) * 8 + 8;
          local_70 = sVar1;
          *(undefined8 *)(__dest + -8) = 0x10d0e2;
          memcpy(puVar11,pnVar9,sVar1);
          puVar4 = local_68;
          sVar1 = local_70;
          puVar11 = (undefined1 *)((long)local_50 + lVar16 * 8);
          *(undefined8 *)(__dest + -8) = 0x10d0f7;
          memcpy(puVar11,puVar4,sVar1);
        }
        lVar16 = local_88;
        pos = local_90;
        uVar19 = uVar15 + 1 >> 1;
        pnVar7->sz = uVar19;
        iVar5 = uVar15 - uVar19;
        pnVar9->sz = iVar5;
        uVar17 = (ulong)(uint)pnVar7->sz;
        if (0 < pnVar7->sz) {
          lVar10 = 0;
          do {
            (pnVar7->field_0).val[lVar10] = *(long *)(local_58 + lVar10 * 8);
            pnVar7 = *local_48;
            pnVar7->keyvalue[lVar10] = *(unsigned_long_long *)((long)local_50 + lVar10 * 8);
            lVar10 = lVar10 + 1;
            uVar17 = (ulong)pnVar7->sz;
          } while (lVar10 < (long)uVar17);
          pnVar9 = local_40[local_88];
          iVar5 = pnVar9->sz;
        }
        if (0 < iVar5) {
          lVar10 = 0;
          do {
            (pnVar9->field_0).val[lVar10] = *(long *)(local_58 + ((int)uVar17 + lVar10) * 8);
            uVar17 = (ulong)(*local_48)->sz;
            pnVar9 = local_40[local_88];
            pnVar9->keyvalue[lVar10] =
                 *(unsigned_long_long *)((long)local_50 + (uVar17 + lVar10) * 8);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pnVar9->sz);
        }
        pDVar13 = local_38->file;
        plVar12 = local_90 + (long)local_38->depth + -1;
        p_Var2 = (pDVar13->
                 super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                 )._vptr_FileManager_Base[3];
        *(undefined8 *)(__dest + -8) = 0x10d1c1;
        (*p_Var2)(pDVar13,plVar12);
        pDVar13 = local_38->file;
        iVar5 = local_38->depth;
        p_Var2 = (pDVar13->
                 super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                 )._vptr_FileManager_Base[3];
        *(undefined8 *)(__dest + -8) = 0x10d1da;
        (*p_Var2)(pDVar13,pos + iVar5);
        pp = local_60;
        this_00 = local_38;
        puVar11 = local_80;
        p = local_40;
        if (1 < local_38->depth) {
          uVar17 = (ulong)(local_38->depth - 1);
          do {
            uVar15 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar15;
            if (local_40[uVar17]->keyvalue[local_60[uVar17]] == local_78) {
              local_40[uVar17]->keyvalue[local_60[uVar17]] = local_40[lVar16]->keyvalue[0];
              pDVar13 = local_38->file;
              p_Var2 = (pDVar13->
                       super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                       )._vptr_FileManager_Base[3];
              *(undefined8 *)(__dest + -8) = 0x10d29b;
              (*p_Var2)(pDVar13,pos + uVar17);
              this_00 = local_38;
              puVar11 = local_80;
              p = local_40;
              break;
            }
          } while (0 < (int)uVar15);
        }
      }
      goto LAB_0010d2a7;
    }
    pDVar13 = local_38->file;
    plVar12 = pos + lVar16 + -1;
    pp_Var8 = (pDVar13->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base;
  }
  uStack_a0 = 0x10cec3;
  (*pp_Var8[3])(pDVar13,plVar12);
  puVar11 = auStack_98;
LAB_0010d2a7:
  *(undefined8 *)(puVar11 + -8) = 0x10d2af;
  operator_delete__(p);
  *(undefined8 *)(puVar11 + -8) = 0x10d2b7;
  operator_delete__(pp);
  *(undefined8 *)(puVar11 + -8) = 0x10d2bf;
  operator_delete__(pos);
  this_00->siz = this_00->siz + -1;
  return true;
}

Assistant:

bool erase(const Key &key) {
            if (!depth)return 0;
            int i, j;
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth + 1];
            memset(pos, 0, sizeof pos);
            p = new node *[depth + 1];
            pp = new int[depth + 1];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(key, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j == p[depth - 1]->sz || Compare()(key, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = x->keyvalue[1];
                        file->save(pos[i]);
                        break;
                    }
            }
            //file->release(x->pointer[j]);
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->val[i - 1] = x->val[i];
            --x->sz;
            if (depth == 1) {
                if (!x->sz) {
                    depth = 0;
                    file->release(root);
                    root = -1;
                } else {
                    file->save(root);
                }
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (x->sz >= degree >> 1) {
                file->save(pos[depth - 1]);
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (pp[depth - 2] == p[depth - 2]->sz) {
                p[depth] = p[depth - 1];
                pp[depth] = pp[depth - 2];
                pos[depth] = pos[depth - 1];
                pp[depth - 2] = p[depth - 2]->sz - 1;
                pos[depth - 1] = p[depth - 2]->pointer[pp[depth - 2]];
                p[depth - 1] = file->read(pos[depth - 1]);
            } else {
                pp[depth] = pp[depth - 2] + 1;
                pos[depth] = p[depth - 2]->pointer[pp[depth]];
                p[depth] = file->read(pos[depth]);
            }
            node *&y = p[depth];
            if (x->sz + y->sz < degree) {
                for (i = 0; i < y->sz; ++i)x->val[x->sz + i] = y->val[i], x->keyvalue[x->sz + i] = y->keyvalue[i];
                x->nxt = y->nxt;
                x->sz += y->sz;
                file->save(pos[depth - 1]);
                file->release(pos[depth]);
                erasenonleaf(depth - 2, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz;
                T tmpv[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                for (i = x->sz; i < newsz; ++i)tmpv[i] = y->val[i - x->sz], tmpk[i] = y->keyvalue[i - x->sz];
                x->sz = newsz + 1 >> 1;
                y->sz = newsz - x->sz;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                for (i = 0; i < y->sz; ++i)y->val[i] = tmpv[i + x->sz], y->keyvalue[i] = tmpk[i + x->sz];
                file->save(pos[depth - 1]);
                file->save(pos[depth]);
                for (i = depth - 2; i >= 0; --i)
                    if (equal(old, p[i]->keyvalue[pp[i]])) {
                        p[i]->keyvalue[pp[i]] = y->keyvalue[0];
                        file->save(pos[i]);
                        break;
                    }
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            --siz;
            return 1;
        }